

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_DeleteMonitoredItems
               (UA_Server *server,UA_Session *session,UA_DeleteMonitoredItemsRequest *request,
               UA_DeleteMonitoredItemsResponse *response)

{
  UA_StatusCode UVar1;
  UA_Subscription *sub;
  UA_StatusCode *pUVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  
  sVar4 = request->monitoredItemIdsSize;
  if (sVar4 == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    sub = UA_Session_getSubscriptionByID(session,request->subscriptionId);
    if (sub == (UA_Subscription *)0x0) {
      UVar1 = 0x80280000;
    }
    else {
      sub->currentLifetimeCount = 0;
      pUVar2 = (UA_StatusCode *)malloc(sVar4 * 4);
      response->results = pUVar2;
      if (pUVar2 != (UA_StatusCode *)0x0) {
        response->resultsSize = sVar4;
        for (uVar3 = 0; uVar3 < sVar4; uVar3 = uVar3 + 1) {
          UVar1 = UA_Subscription_deleteMonitoredItem(server,sub,request->monitoredItemIds[uVar3]);
          response->results[uVar3] = UVar1;
          sVar4 = request->monitoredItemIdsSize;
        }
        return;
      }
      UVar1 = 0x80030000;
    }
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_DeleteMonitoredItems(UA_Server *server, UA_Session *session,
                                  const UA_DeleteMonitoredItemsRequest *request,
                                  UA_DeleteMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteMonitoredItemsRequest");

    if(request->monitoredItemIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    /* Get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    response->results = UA_malloc(sizeof(UA_StatusCode) * request->monitoredItemIdsSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->monitoredItemIdsSize;

    for(size_t i = 0; i < request->monitoredItemIdsSize; ++i)
        response->results[i] = UA_Subscription_deleteMonitoredItem(server, sub, request->monitoredItemIds[i]);
}